

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_impl.hpp
# Opt level: O2

double duckdb_jaro_winkler::detail::jaro_winkler_similarity<char_const*,char_const*>
                 (char *P_first,char *P_last,char *T_first,char *T_last,double prefix_weight,
                 double score_cutoff)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  double dVar4;
  
  pcVar3 = T_last + -(long)T_first;
  if ((long)(P_last + -(long)P_first) <= (long)(T_last + -(long)T_first)) {
    pcVar3 = P_last + -(long)P_first;
  }
  pcVar1 = (char *)0x4;
  if ((long)pcVar3 < 4) {
    pcVar1 = pcVar3;
  }
  pcVar3 = (char *)0x0;
  if ((long)pcVar1 < 1) {
    pcVar1 = pcVar3;
  }
  for (; (pcVar2 = pcVar1, pcVar1 != pcVar3 &&
         (pcVar2 = pcVar3, T_first[(long)pcVar3] == P_first[(long)pcVar3])); pcVar3 = pcVar3 + 1) {
  }
  dVar4 = score_cutoff;
  if (0.7 < score_cutoff) {
    dVar4 = (double)(long)pcVar2 * prefix_weight;
    if (1.0 <= dVar4) {
      dVar4 = 0.7;
    }
    else {
      dVar4 = (dVar4 - score_cutoff) / (dVar4 + -1.0);
      if (dVar4 <= 0.7) {
        dVar4 = 0.7;
      }
    }
  }
  dVar4 = jaro_similarity<char_const*,char_const*>
                    ((detail *)P_first,P_last,T_first,T_last,pcVar3,dVar4);
  if (0.7 < dVar4) {
    dVar4 = dVar4 + (1.0 - dVar4) * (double)(long)pcVar2 * prefix_weight;
  }
  return (double)(-(ulong)(score_cutoff <= dVar4) & (ulong)dVar4);
}

Assistant:

double jaro_winkler_similarity(InputIt1 P_first, InputIt1 P_last, InputIt2 T_first, InputIt2 T_last,
                               double prefix_weight, double score_cutoff)
{
    int64_t P_len = std::distance(P_first, P_last);
    int64_t T_len = std::distance(T_first, T_last);
    int64_t min_len = std::min(P_len, T_len);
    int64_t prefix = 0;
    int64_t max_prefix = std::min<int64_t>(min_len, 4);

    for (; prefix < max_prefix; ++prefix) {
        if (T_first[prefix] != P_first[prefix]) {
            break;
        }
    }

    double jaro_score_cutoff = score_cutoff;
    if (jaro_score_cutoff > 0.7) {
        double prefix_sim = prefix * prefix_weight;

        if (prefix_sim >= 1.0) {
            jaro_score_cutoff = 0.7;
        }
        else {
            jaro_score_cutoff =
                std::max(0.7, (prefix_sim - jaro_score_cutoff) / (prefix_sim - 1.0));
        }
    }

    double Sim = jaro_similarity(P_first, P_last, T_first, T_last, jaro_score_cutoff);
    if (Sim > 0.7) {
        Sim += prefix * prefix_weight * (1.0 - Sim);
    }

    return common::result_cutoff(Sim, score_cutoff);
}